

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParsePubidLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  byte bVar5;
  xmlParserErrors code;
  ulong uVar6;
  bool bVar7;
  
  bVar5 = *ctxt->input->cur;
  if (bVar5 != 0x22) {
    if (bVar5 != 0x27) {
      pxVar3 = (xmlChar *)0x0;
      code = XML_ERR_LITERAL_NOT_STARTED;
      goto LAB_00135673;
    }
    bVar5 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar3 = (xmlChar *)(*xmlMalloc)(100);
  if (pxVar3 == (xmlChar *)0x0) {
    xmlCtxtErrMemory(ctxt);
    return (xmlChar *)0x0;
  }
  bVar1 = *ctxt->input->cur;
  uVar4 = (ulong)bVar1;
  bVar7 = bVar5 == bVar1;
  uVar6 = 0;
  if ((""[uVar4] != '\0') && (bVar5 != bVar1)) {
    uVar6 = 0;
    if (ctxt->disableSAX < 2) {
      uVar6 = 0;
      do {
        if (uVar6 == 99) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Public ID");
          (*xmlFree)(pxVar3);
          return (xmlChar *)0x0;
        }
        pxVar3[uVar6] = (xmlChar)uVar4;
        xmlNextChar(ctxt);
        bVar1 = *ctxt->input->cur;
        uVar4 = (ulong)bVar1;
        bVar7 = bVar5 == bVar1;
        if ((""[uVar4] == '\0') || (bVar5 == bVar1)) {
          uVar6 = (ulong)((int)uVar6 + 1);
          break;
        }
        uVar6 = uVar6 + 1;
      } while (ctxt->disableSAX < 2);
    }
    uVar6 = uVar6 & 0xffffffff;
  }
  pxVar3[uVar6] = '\0';
  if (bVar7) {
    pxVar2 = ctxt->input;
    if (*pxVar2->cur == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    pxVar2->cur = pxVar2->cur + 1;
    return pxVar3;
  }
  code = XML_ERR_LITERAL_NOT_FINISHED;
LAB_00135673:
  xmlFatalErr(ctxt,code,(char *)0x0);
  return pxVar3;
}

Assistant:

xmlChar *
xmlParsePubidLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;
    xmlChar stop;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = CUR;
    while ((IS_PUBIDCHAR_CH(cur)) && (cur != stop) &&
           (PARSER_STOPPED(ctxt) == 0)) { /* checked */
	if (len + 1 >= size) {
	    xmlChar *tmp;
            int newSize;

	    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Public ID");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, size);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = cur;
	NEXT;
	cur = CUR;
    }
    buf[len] = 0;
    if (cur != stop) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXTL(1);
    }
    return(buf);
}